

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

value_reference_type __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::operator*(iterator_base<true> *this)

{
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_00;
  database *db;
  bool bVar1;
  address addr;
  type ppVar2;
  value_type local_38;
  undefined1 local_18 [16];
  iterator_base<true> *this_local;
  
  local_18._8_8_ = this;
  bVar1 = std::operator==(&this->pos_,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = this->index_;
    db = this->db_;
    addr = get_address(this);
    load_leaf_node(&local_38,this_00,db,addr);
    std::
    make_unique<std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>,std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>>
              ((pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)local_18);
    std::
    unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ::operator=(&this->pos_,
                (unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
                 *)local_18);
    std::
    unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ::~unique_ptr((unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
                   *)local_18);
  }
  ppVar2 = std::
           unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
           ::operator*(&this->pos_);
  return ppVar2;
}

Assistant:

value_reference_type operator* () const {
                    if (pos_ == nullptr) {
                        pos_ = std::make_unique<value_type> (
                            index_->load_leaf_node (db_, this->get_address ()));
                    }
                    return *pos_;
                }